

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::Read
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this,
          TPZStream *buf,void *context)

{
  TPZSavable *pTVar1;
  TPZDohrMatrix<std::complex<double>,TPZDohrSubstruct<std::complex<double>>> *in_RDX;
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  *in_RSI;
  TPZStream *in_RDI;
  TPZDohrMatrix<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *ptr;
  _func_int **local_38;
  TPZStream *in_stack_ffffffffffffffd8;
  TPZBaseMatrix *in_stack_ffffffffffffffe0;
  TPZDohrMatrix<std::complex<double>,TPZDohrSubstruct<std::complex<double>>> *__x;
  
  TPZBaseMatrix::Read(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  __x = in_RDX;
  TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator=
            ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_stack_ffffffffffffffd8,
             (TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_RDI);
  TPZDohrMatrix<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>::
  SubStructures_abi_cxx11_(in_RDX);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  ::operator=(in_RSI,(list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                      *)__x);
  (*(code *)(in_RSI->
            super__List_base<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next[0xf]._M_prev)(in_RSI,in_RDI + 8,1);
  (*(code *)(in_RSI->
            super__List_base<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next[0xe]._M_prev)(in_RSI,in_RDI + 9,1);
  pTVar1 = TPZPersistenceManager::GetInstance(in_RDI);
  if (pTVar1 == (TPZSavable *)0x0) {
    local_38 = (_func_int **)0x0;
  }
  else {
    local_38 = (_func_int **)
               __dynamic_cast(pTVar1,&TPZSavable::typeinfo,
                              &TPZStepSolver<std::complex<double>>::typeinfo,0);
  }
  in_RDI[7]._vptr_TPZStream = local_38;
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf,context);
    TPZDohrMatrix<TVar,TSubStruct> *ptr = (TPZDohrMatrix<TVar,TSubStruct> *)(context);
    fAssemble = ptr->fAssembly;
    fGlobal = ptr->SubStructures();
    buf.Read(&fNumCoarse);
    buf.Read(&fNumThreads);
    fCoarse = dynamic_cast<TPZStepSolver<TVar> *>(TPZPersistenceManager::GetInstance(&buf));
}